

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int get_decimals(int Decimals,int64_t IntValue)

{
  int local_2c;
  long local_28;
  int64_t TmpVal;
  int Result;
  int64_t IntValue_local;
  int Decimals_local;
  
  TmpVal._4_4_ = 0;
  for (local_28 = IntValue + 1; local_28 < 0xccccccccccccccc; local_28 = local_28 * 10) {
    TmpVal._4_4_ = TmpVal._4_4_ + 1;
  }
  local_2c = Decimals;
  if (TmpVal._4_4_ < Decimals) {
    local_2c = TmpVal._4_4_;
  }
  return local_2c;
}

Assistant:

static int get_decimals(int Decimals, int64_t IntValue)
{
    int Result = 0;
    int64_t TmpVal = IntValue+1;
    while (TmpVal < INT64_MAX/10)
    {
        TmpVal *= 10;
        Result++;
    }
    return MIN(Decimals,Result);
}